

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_appendArray_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  private_ACUtilsTest_ADynArray_CharArray array;
  
  array.buffer = (char *)0x0;
  array.reallocator._0_4_ = 0x10a480;
  array.reallocator._4_4_ = 0;
  array.deallocator._0_4_ = 0x10a4c0;
  array.deallocator._4_4_ = 0;
  array.size = 5;
  array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
  array.capacity = 5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  uStack_50 = 0x114f87;
  array.buffer = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,5);
  builtin_strncpy(array.buffer,"01234",5);
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  uStack_50 = 0x114fc1;
  bVar1 = private_ACUtils_ADynArray_insertArray(&array,0xffffffffffffffff,"56",3,1);
  if (bVar1 == true) {
    uStack_50 = 0x114fdb;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x546);
    if (array.size == 8) {
      uStack_50 = 0x114ffb;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x547);
      if (array.capacity == 8) {
        uStack_50 = 0x11501b;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x548);
        if (array.buffer == (char *)0x0) {
          pcVar6 = "(void*) array.buffer != NULL";
          pcVar7 = "(void*) array.buffer";
          iVar2 = 0x549;
LAB_00115232:
          uStack_50 = 0;
          local_58 = (char *)0x0;
          pcStack_60 = (char *)0x115239;
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,iVar2,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x",pcVar6,pcVar7);
        }
        uStack_50 = 0x115038;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x549);
        pcVar4 = array.buffer;
        if (array.buffer == (char *)0x0) {
          pcVar6 = "";
          pcVar4 = "(null)";
        }
        else {
          uStack_50 = 0x115055;
          iVar2 = strcmp("0123456",array.buffer);
          if (iVar2 == 0) {
            uStack_50 = 0x11506e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x54a);
            if (array.growStrategy == (ACUtilsGrowStrategy)0x0) {
              pcVar6 = "(void*) array.growStrategy != NULL";
              pcVar7 = "(void*) array.growStrategy";
              iVar2 = 0x54b;
              goto LAB_00115232;
            }
            uStack_50 = 0x11508b;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,0x54b);
            if (private_ACUtilsTest_ADynArray_reallocCount == 1) {
              uStack_50 = 0x1150ad;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x54c);
              uStack_50 = 0x1150b6;
              (*(code *)CONCAT44(array.deallocator._4_4_,array.deallocator._0_4_))(array.buffer);
              return;
            }
            pcStack_60 = "1";
            pcVar7 = "private_ACUtilsTest_ADynArray_reallocCount == 1";
            pcVar8 = "private_ACUtilsTest_ADynArray_reallocCount";
            iVar2 = 0x54c;
            pcVar6 = (char *)private_ACUtilsTest_ADynArray_reallocCount;
            goto LAB_00115268;
          }
          pcVar6 = "\"";
        }
        expr = 
        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
        ;
        pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
        pcVar7 = "array.buffer == \"0123456\"";
        pcVar8 = "array.buffer";
        iVar2 = 0x54a;
        local_58 = "\"";
        pcStack_60 = "0123456";
        pcStack_68 = "\"";
        pcStack_70 = "\"0123456\"";
        ppcVar5 = &pcStack_80;
        pcStack_80 = pcVar4;
        pcStack_78 = pcVar6;
        goto LAB_00115270;
      }
      pcVar7 = "array.capacity == 8";
      pcVar8 = "array.capacity";
      iVar2 = 0x548;
      pcVar6 = (char *)array.capacity;
    }
    else {
      pcVar7 = "array.size == 8";
      pcVar8 = "array.size";
      iVar2 = 0x547;
      pcVar6 = (char *)array.size;
    }
    pcStack_60 = "8";
    local_58 = (char *)0x8;
  }
  else {
    pcVar6 = (char *)(ulong)bVar1;
    pcStack_60 = "true";
    pcVar7 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer)) == true"
    ;
    pcVar8 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, \"56\\0\", 3, sizeof(*(&array)->buffer))";
    iVar2 = 0x546;
LAB_00115268:
    local_58 = (char *)0x1;
  }
  expr = "Assertion \'_ck_x == _ck_y\' failed";
  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
  ppcVar5 = &pcStack_60;
LAB_00115270:
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar6;
  *(code **)((long)ppcVar5 + -0x10) = test_ADynArray_appendArray_success_nullptrArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,expr,pcVar3,pcVar7,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendArray_success_notEnoughCapacity)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity);
    memcpy(array.buffer, "01234", 5);
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_appendArray(&array, "56\0", 3), true);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 8);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "0123456");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 1);
    array.deallocator(array.buffer);
}